

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrefcnt.cpp
# Opt level: O2

void __thiscall CVmWeakRefable::CVmWeakRefable(CVmWeakRefable *this)

{
  OS_Mutex *this_00;
  
  (this->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (this->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__CVmWeakRefable_0031f5d8;
  this->weakref = (CVmWeakRef *)0x0;
  this_00 = (OS_Mutex *)operator_new(0x38);
  OS_Mutex::OS_Mutex(this_00);
  this->mu = this_00;
  return;
}

Assistant:

CVmWeakRefable::CVmWeakRefable()
{
    /* we don't have a weak ref yet */
    weakref = 0;

    /* create our mutex */
    mu = new OS_Mutex();
}